

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

CBString * uniqueItemName(CBString *__return_storage_ptr__,UModelIndex *index)

{
  TreeModel *this;
  byte bVar1;
  UINT8 UVar2;
  UINT8 subtype;
  CBString subtypeString;
  CBString fileText;
  CBString itemName;
  CBString itemText;
  UModelIndex UStack_128;
  CBString local_110;
  CBString local_f8;
  CBString local_e0;
  CBString local_c8;
  CBString local_b0;
  CBString local_98;
  CBString local_80;
  CBString local_68;
  CBString local_50;
  CBString local_38;
  
  this = index->m;
  if ((index->c | index->r) < 0 || this == (TreeModel *)0x0) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  TreeModel::name(&local_b0,this,index);
  TreeModel::text(&local_80,this,index);
  Bstrlib::CBString::CBString(__return_storage_ptr__,&local_b0);
  bVar1 = TreeModel::type(this,index);
  if ((bVar1 - 0x4f < 6) || (bVar1 == 0x42)) {
    if (local_80.super_tagbstring.slen == 0) {
      Bstrlib::CBString::CBString((CBString *)&UStack_128,&local_b0);
    }
    else {
      Bstrlib::CBString::operator+(&local_f8,&local_b0,'_');
      Bstrlib::CBString::operator+((CBString *)&UStack_128,&local_f8,&local_80);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,(CBString *)&UStack_128);
    Bstrlib::CBString::~CBString((CBString *)&UStack_128);
    if (local_80.super_tagbstring.slen == 0) goto LAB_0012e1d6;
  }
  else {
    if (bVar1 != 0x43) goto LAB_0012e1d6;
    TreeModel::findParentOfType(&UStack_128,this,index,'B');
    TreeModel::text(&local_f8,this,&UStack_128);
    if (local_f8.super_tagbstring.slen == 0) {
      TreeModel::name(&local_110,this,&UStack_128);
    }
    else {
      TreeModel::name(&local_50,this,&UStack_128);
      Bstrlib::CBString::operator+(&local_38,&local_50,'_');
      Bstrlib::CBString::operator+(&local_110,&local_38,&local_f8);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
    Bstrlib::CBString::~CBString(&local_110);
    if (local_f8.super_tagbstring.slen != 0) {
      Bstrlib::CBString::~CBString(&local_38);
      Bstrlib::CBString::~CBString(&local_50);
    }
    UVar2 = TreeModel::subtype(this,index);
    if ((UVar2 == '\x02') || (UVar2 = TreeModel::subtype(this,index), UVar2 == '\x18')) {
      TreeModel::name(&local_e0,this,index);
      Bstrlib::CBString::operator+(&local_c8,&local_e0,'_');
      Bstrlib::CBString::operator+(&local_110,&local_c8,__return_storage_ptr__);
      Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
      Bstrlib::CBString::~CBString(&local_110);
      Bstrlib::CBString::~CBString(&local_c8);
      Bstrlib::CBString::~CBString(&local_e0);
    }
  }
  Bstrlib::CBString::~CBString(&local_f8);
LAB_0012e1d6:
  UVar2 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((CBString *)&UStack_128,UVar2,subtype);
  UVar2 = TreeModel::type(this,index);
  itemTypeToUString(&local_68,UVar2);
  if (UStack_128.i._4_4_ == 0) {
    Bstrlib::CBString::CBString(&local_98);
  }
  else {
    Bstrlib::operator+(&local_98,'_',(CBString *)&UStack_128);
  }
  Bstrlib::CBString::operator+(&local_e0,&local_68,&local_98);
  Bstrlib::CBString::operator+(&local_c8,&local_e0,'_');
  Bstrlib::CBString::operator+(&local_110,&local_c8,__return_storage_ptr__);
  Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
  Bstrlib::CBString::~CBString(&local_110);
  Bstrlib::CBString::~CBString(&local_c8);
  Bstrlib::CBString::~CBString(&local_e0);
  Bstrlib::CBString::~CBString(&local_98);
  Bstrlib::CBString::~CBString(&local_68);
  fixFileName(__return_storage_ptr__,true);
  Bstrlib::CBString::~CBString((CBString *)&UStack_128);
  Bstrlib::CBString::~CBString(&local_80);
  Bstrlib::CBString::~CBString(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}